

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_FilesDeletedAfterCompaction_Test::TestBody
          (DBTest_FilesDeletedAfterCompaction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Slice local_150;
  AssertHelper local_140;
  Message local_138;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100;
  undefined1 local_e0 [24];
  AssertionResult gtest_ar_1;
  int i;
  int num_files;
  Slice local_a8;
  uint local_94;
  AssertHelper local_90;
  Message local_88;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50;
  undefined1 local_30 [24];
  AssertionResult gtest_ar;
  DBTest_FilesDeletedAfterCompaction_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"foo",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"v2",&local_79);
  DBTest::Put((DBTest *)local_30,(string *)this,&local_50);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)(local_30 + 0x10),
             local_30 + 0xf,(Status *)"Put(\"foo\", \"v2\")");
  Status::~Status((Status *)local_30);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_30 + 0x10));
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_30 + 0x10));
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x74a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  local_94 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_30 + 0x10));
  if (local_94 == 0) {
    Slice::Slice(&local_a8,"a");
    Slice::Slice((Slice *)&i,"z");
    DBTest::Compact(&this->super_DBTest,&local_a8,(Slice *)&i);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = DBTest::CountFiles(&this->super_DBTest);
    for (gtest_ar_1.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_ = 0;
        (int)gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 10;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (int)gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 1) {
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,"foo",&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"v2",&local_129);
      DBTest::Put((DBTest *)local_e0,(string *)this,&local_100);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)(local_e0 + 0x10),
                 local_e0 + 0xf,(Status *)"Put(\"foo\", \"v2\")");
      Status::~Status((Status *)local_e0);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_e0 + 0x10));
      if (!bVar1) {
        testing::Message::Message(&local_138);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_e0 + 0x10));
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x74e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        testing::Message::~Message(&local_138);
      }
      local_94 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)(local_e0 + 0x10));
      if (local_94 != 0) {
        return;
      }
      Slice::Slice(&local_150,"a");
      Slice::Slice((Slice *)&gtest_ar_2.message_,"z");
      DBTest::Compact(&this->super_DBTest,&local_150,(Slice *)&gtest_ar_2.message_);
    }
    local_174 = DBTest::CountFiles(&this->super_DBTest);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_170,"CountFiles()","num_files",&local_174,
               (int *)((long)&gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x751,pcVar2);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      testing::Message::~Message(&local_180);
    }
    local_94 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  }
  return;
}

Assistant:

TEST_F(DBTest, FilesDeletedAfterCompaction) {
  ASSERT_LEVELDB_OK(Put("foo", "v2"));
  Compact("a", "z");
  const int num_files = CountFiles();
  for (int i = 0; i < 10; i++) {
    ASSERT_LEVELDB_OK(Put("foo", "v2"));
    Compact("a", "z");
  }
  ASSERT_EQ(CountFiles(), num_files);
}